

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

RPCHelpMan * getrawaddrman(void)

{
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  RPCMethodImpl fun;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  long lVar3;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined4 in_stack_fffffffffffff248;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffff24c;
  undefined8 in_stack_fffffffffffff250;
  undefined8 in_stack_fffffffffffff258;
  undefined8 in_stack_fffffffffffff260;
  _Manager_type in_stack_fffffffffffff268;
  undefined8 in_stack_fffffffffffff270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff278;
  pointer in_stack_fffffffffffff288;
  pointer pRVar5;
  pointer in_stack_fffffffffffff290;
  pointer pRVar6;
  pointer in_stack_fffffffffffff298;
  pointer pRVar7;
  undefined8 in_stack_fffffffffffff2a0;
  pointer pRVar8;
  pointer pRVar9;
  pointer pRVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff2c0;
  pointer in_stack_fffffffffffff2d0;
  _Any_data in_stack_fffffffffffff2d8;
  pointer pRVar11;
  pointer pRVar12;
  allocator<char> local_cfa;
  allocator<char> local_cf9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_cf8;
  allocator<char> local_cd9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_cd8;
  allocator<char> local_cba;
  allocator<char> local_cb9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_cb8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c98;
  allocator<char> local_c79;
  vector<RPCResult,_std::allocator<RPCResult>_> local_c78;
  allocator<char> local_c5a;
  allocator<char> local_c59;
  vector<RPCResult,_std::allocator<RPCResult>_> local_c58;
  allocator<char> local_c3a;
  allocator<char> local_c39;
  vector<RPCResult,_std::allocator<RPCResult>_> local_c38;
  allocator<char> local_c12;
  allocator<char> local_c11;
  vector<RPCResult,_std::allocator<RPCResult>_> local_c10;
  allocator<char> local_bf2;
  allocator<char> local_bf1;
  vector<RPCResult,_std::allocator<RPCResult>_> local_bf0;
  allocator<char> local_bd2;
  allocator<char> local_bd1;
  vector<RPCResult,_std::allocator<RPCResult>_> local_bd0;
  allocator<char> local_bb2;
  allocator<char> local_bb1;
  RPCResults local_bb0;
  vector<RPCArg,_std::allocator<RPCArg>_> local_b98;
  allocator<char> local_b72;
  allocator<char> local_b71;
  string local_b70;
  string local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab0;
  char *local_a90;
  size_type local_a88;
  char local_a80 [8];
  undefined8 uStack_a78;
  string local_a70 [32];
  string local_a50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  string local_9d0 [32];
  string local_9b0 [32];
  string local_990 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  string local_930 [32];
  string local_910 [32];
  string local_8f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  string local_870 [32];
  string local_850 [32];
  string local_830 [32];
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [32];
  string local_7b0 [32];
  RPCResult local_790 [4];
  RPCResult local_570;
  RPCResult local_4e8;
  RPCResult local_460;
  RPCResult local_3d8;
  RPCResult local_350;
  string local_2c8 [32];
  string local_2a8 [32];
  RPCResult local_288;
  string local_200 [32];
  string local_1e0 [32];
  RPCResult local_1c0;
  string local_138 [32];
  string local_118 [32];
  RPCResult local_f8;
  string local_70 [32];
  string local_50 [32];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"getrawaddrman",&local_b71);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,
             "EXPERIMENTAL warning: this call may be changed in future releases.\n\nReturns information on all address manager entries for the new and tried tables.\n"
             ,&local_b72);
  local_b98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_118,"",&local_bb1);
  std::__cxx11::string::string<std::allocator<char>>(local_138,"",&local_bb2);
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"table",&local_bd1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_200,"buckets with addresses in the address manager table ( new, tried )",
             &local_bd2);
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"bucket/position",&local_bf1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2c8,"the location in the address manager table (<bucket>/<position>)",&local_bf2)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_7b0,"address",&local_c11);
  std::__cxx11::string::string<std::allocator<char>>(local_7d0,"The address of the node",&local_c12)
  ;
  local_c38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff24c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff248;
  m_key_name._M_string_length = in_stack_fffffffffffff250;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff258;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff260;
  description._M_string_length = in_stack_fffffffffffff270;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff268;
  description.field_2 = in_stack_fffffffffffff278;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff290;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff288;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff298;
  RPCResult::RPCResult(local_790,STR,m_key_name,description,inner,SUB81(local_7b0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_7f0,"mapped_as",&local_c39);
  std::__cxx11::string::string<std::allocator<char>>
            (local_810,"The ASN mapped to the IP of this peer per our current ASMap",&local_c3a);
  local_c58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = 0;
  auVar1._4_8_ = in_stack_fffffffffffff250;
  auVar1._0_4_ = in_stack_fffffffffffff24c;
  auVar1._12_8_ = in_stack_fffffffffffff258;
  auVar1._20_8_ = in_stack_fffffffffffff260;
  auVar1._28_4_ = 0;
  description_00._M_string_length = in_stack_fffffffffffff270;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff268;
  description_00.field_2 = in_stack_fffffffffffff278;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff290;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff288;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff298;
  RPCResult::RPCResult
            (local_790 + 1,NUM,(string)(auVar1 << 0x20),SUB81(local_7f0,0),description_00,inner_00,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_830,"port",&local_c59);
  std::__cxx11::string::string<std::allocator<char>>
            (local_850,"The port number of the node",&local_c5a);
  local_c78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff24c;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_00._M_string_length = in_stack_fffffffffffff250;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff258;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff260;
  description_01._M_string_length = in_stack_fffffffffffff270;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff268;
  description_01.field_2 = in_stack_fffffffffffff278;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff290;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff288;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff298;
  RPCResult::RPCResult(local_790 + 2,NUM,m_key_name_00,description_01,inner_01,SUB81(local_830,0));
  std::__cxx11::string::string<std::allocator<char>>(local_870,"network",&local_c79);
  GetNetworkNames_abi_cxx11_(&local_c98,false);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_8d0,(util *)&local_c98,", ");
  std::operator+(&local_8b0,"The network (",&local_8d0);
  std::operator+(&local_890,&local_8b0,") of the address");
  local_cb8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_cb8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_cb8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff24c;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_01._M_string_length = in_stack_fffffffffffff250;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff258;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff260;
  description_02._M_string_length = in_stack_fffffffffffff270;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff268;
  description_02.field_2 = in_stack_fffffffffffff278;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff290;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff288;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff298;
  RPCResult::RPCResult(local_790 + 3,STR,m_key_name_01,description_02,inner_02,SUB81(local_870,0));
  std::__cxx11::string::string<std::allocator<char>>(local_8f0,"services",&local_cb9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_910,"The services offered by the node",&local_cba);
  local_cd8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_cd8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_cd8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff24c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_02._M_string_length = in_stack_fffffffffffff250;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff258;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff260;
  description_03._M_string_length = in_stack_fffffffffffff270;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff268;
  description_03.field_2 = in_stack_fffffffffffff278;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff290;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff288;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff298;
  RPCResult::RPCResult(&local_570,NUM,m_key_name_02,description_03,inner_03,SUB81(local_8f0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_930,"time",&local_cd9);
  std::operator+(&local_970,"The ",&UNIX_EPOCH_TIME_abi_cxx11_);
  std::operator+(&local_950,&local_970," when the node was last seen");
  local_cf8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_cf8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_cf8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff24c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_03._M_string_length = in_stack_fffffffffffff250;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff258;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff260;
  description_04._M_string_length = in_stack_fffffffffffff270;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff268;
  description_04.field_2 = in_stack_fffffffffffff278;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff290;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff288;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff298;
  RPCResult::RPCResult(&local_4e8,NUM_TIME,m_key_name_03,description_04,inner_04,SUB81(local_930,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_990,"source",&local_cf9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_9b0,"The address that relayed the address to us",&local_cfa);
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff24c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_04._M_string_length = in_stack_fffffffffffff250;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_fffffffffffff258;
  m_key_name_04.field_2._8_8_ = in_stack_fffffffffffff260;
  description_05._M_string_length = in_stack_fffffffffffff270;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff268;
  description_05.field_2 = in_stack_fffffffffffff278;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff290;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff288;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff298;
  RPCResult::RPCResult(&local_460,STR,m_key_name_04,description_05,inner_05,SUB81(local_990,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_9d0,"source_network",(allocator<char> *)&stack0xfffffffffffff2e7);
  GetNetworkNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xfffffffffffff2c8,false);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_a30,(util *)&stack0xfffffffffffff2c8,", ");
  std::operator+(&local_a10,"The network (",&local_a30);
  std::operator+(&local_9f0,&local_a10,") of the source address");
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff24c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_05._M_string_length = in_stack_fffffffffffff250;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_fffffffffffff258;
  m_key_name_05.field_2._8_8_ = in_stack_fffffffffffff260;
  description_06._M_string_length = in_stack_fffffffffffff270;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff268;
  description_06.field_2 = in_stack_fffffffffffff278;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff290;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff288;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff298;
  RPCResult::RPCResult(&local_3d8,STR,m_key_name_05,description_06,inner_06,SUB81(local_9d0,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_a50,"source_mapped_as",(allocator<char> *)&stack0xfffffffffffff2a7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a70,"The ASN mapped to the IP of this peer\'s source per our current ASMap",
             (allocator<char> *)&stack0xfffffffffffff2a6);
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  uVar4 = 0;
  auVar2._4_8_ = in_stack_fffffffffffff250;
  auVar2._0_4_ = in_stack_fffffffffffff24c;
  auVar2._12_8_ = in_stack_fffffffffffff258;
  auVar2._20_8_ = in_stack_fffffffffffff260;
  auVar2._28_4_ = 0;
  description_07._M_string_length = in_stack_fffffffffffff270;
  description_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff268;
  description_07.field_2._M_local_buf = in_stack_fffffffffffff278._M_local_buf;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult
            (&local_350,NUM,(string)(auVar2 << 0x20),SUB81(local_a50,0),description_07,inner_07,true
            );
  __l._M_len = 9;
  __l._M_array = local_790;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_c10,__l,(allocator_type *)&stack0xfffffffffffff287);
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff24c;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_06._M_string_length = in_stack_fffffffffffff250;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_fffffffffffff258;
  m_key_name_06.field_2._8_8_ = in_stack_fffffffffffff260;
  description_08._M_string_length = in_stack_fffffffffffff270;
  description_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff268;
  description_08.field_2._M_local_buf = in_stack_fffffffffffff278._M_local_buf;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar6;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar5;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar7;
  RPCResult::RPCResult(&local_288,OBJ,m_key_name_06,description_08,inner_08,SUB81(local_2a8,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_288;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_bf0,__l_00,(allocator_type *)&stack0xfffffffffffff286);
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff24c;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_07._M_string_length = in_stack_fffffffffffff250;
  m_key_name_07.field_2._M_allocated_capacity = in_stack_fffffffffffff258;
  m_key_name_07.field_2._8_8_ = in_stack_fffffffffffff260;
  description_09._M_string_length = in_stack_fffffffffffff270;
  description_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff268;
  description_09.field_2._M_local_buf = in_stack_fffffffffffff278._M_local_buf;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar6;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar5;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar7;
  RPCResult::RPCResult(&local_1c0,OBJ_DYN,m_key_name_07,description_09,inner_09,SUB81(local_1e0,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_1c0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_bd0,__l_01,(allocator_type *)&stack0xfffffffffffff285);
  m_key_name_08._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff24c;
  m_key_name_08._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_08._M_string_length = in_stack_fffffffffffff250;
  m_key_name_08.field_2._M_allocated_capacity = in_stack_fffffffffffff258;
  m_key_name_08.field_2._8_8_ = in_stack_fffffffffffff260;
  description_10._M_string_length = in_stack_fffffffffffff270;
  description_10._M_dataplus._M_p = (pointer)in_stack_fffffffffffff268;
  description_10.field_2 = in_stack_fffffffffffff278;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar6;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar5;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar7;
  RPCResult::RPCResult(&local_f8,OBJ_DYN,m_key_name_08,description_10,inner_10,SUB81(local_118,0));
  result._4_4_ = in_stack_fffffffffffff24c;
  result.m_type = uVar4;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff250;
  result.m_key_name._M_string_length = in_stack_fffffffffffff258;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff260;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff268;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff270;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff278;
  result._64_8_ = pRVar5;
  result.m_description._M_dataplus._M_p = (pointer)pRVar6;
  result.m_description._M_string_length = (size_type)pRVar7;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff2a0;
  result.m_description.field_2._8_8_ = pRVar8;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar9;
  result.m_cond._M_string_length = (size_type)pRVar10;
  result.m_cond.field_2 = in_stack_fffffffffffff2c0;
  RPCResults::RPCResults(&local_bb0,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_af0,"getrawaddrman",(allocator<char> *)&stack0xfffffffffffff284);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b10,"",(allocator<char> *)&stack0xfffffffffffff283);
  HelpExampleCli(&local_ad0,&local_af0,&local_b10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b50,"getrawaddrman",(allocator<char> *)&stack0xfffffffffffff282);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b70,"",(allocator<char> *)&stack0xfffffffffffff281);
  HelpExampleRpc(&local_b30,&local_b50,&local_b70);
  std::operator+(&local_ab0,&local_ad0,&local_b30);
  local_a90 = local_a80;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ab0._M_dataplus._M_p == &local_ab0.field_2) {
    uStack_a78 = local_ab0.field_2._8_8_;
  }
  else {
    local_a90 = local_ab0._M_dataplus._M_p;
  }
  local_a88 = local_ab0._M_string_length;
  local_ab0._M_string_length = 0;
  local_ab0.field_2._M_local_buf[0] = '\0';
  description_11._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/net.cpp:1169:9)>
       ::_M_invoke;
  description_11._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/net.cpp:1169:9)>
                ::_M_manager;
  description_11.field_2 = in_stack_fffffffffffff278;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar6;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar5;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar7;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar8;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff2a0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar9;
  examples.m_examples._8_16_ = in_stack_fffffffffffff2c0;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar10;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffff2d0;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar11;
  fun.super__Function_base._M_functor = in_stack_fffffffffffff2d8;
  fun._M_invoker = (_Invoker_type)pRVar12;
  local_ab0._M_dataplus._M_p = (pointer)&local_ab0.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff250,&stack0xfffffffffffff258)),
             description_11,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff258);
  std::__cxx11::string::~string((string *)&local_a90);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::__cxx11::string::~string((string *)&local_b30);
  std::__cxx11::string::~string((string *)&local_b70);
  std::__cxx11::string::~string((string *)&local_b50);
  std::__cxx11::string::~string((string *)&local_ad0);
  std::__cxx11::string::~string((string *)&local_b10);
  std::__cxx11::string::~string((string *)&local_af0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_bb0.m_results);
  RPCResult::~RPCResult(&local_f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_bd0);
  RPCResult::~RPCResult(&local_1c0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_bf0);
  RPCResult::~RPCResult(&local_288);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c10);
  lVar3 = 0x440;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_790[0].m_type + lVar3));
    lVar3 = lVar3 + -0x88;
  } while (lVar3 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff288);
  std::__cxx11::string::~string(local_a70);
  std::__cxx11::string::~string(local_a50);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff2a8);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::__cxx11::string::~string((string *)&local_a10);
  std::__cxx11::string::~string((string *)&local_a30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffff2c8);
  std::__cxx11::string::~string(local_9d0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff2e8);
  std::__cxx11::string::~string(local_9b0);
  std::__cxx11::string::~string(local_990);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_cf8);
  std::__cxx11::string::~string((string *)&local_950);
  std::__cxx11::string::~string((string *)&local_970);
  std::__cxx11::string::~string(local_930);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_cd8);
  std::__cxx11::string::~string(local_910);
  std::__cxx11::string::~string(local_8f0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_cb8);
  std::__cxx11::string::~string((string *)&local_890);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c98);
  std::__cxx11::string::~string(local_870);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c78);
  std::__cxx11::string::~string(local_850);
  std::__cxx11::string::~string(local_830);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c58);
  std::__cxx11::string::~string(local_810);
  std::__cxx11::string::~string(local_7f0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c38);
  std::__cxx11::string::~string(local_7d0);
  std::__cxx11::string::~string(local_7b0);
  std::__cxx11::string::~string(local_2c8);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_118);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_b98);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getrawaddrman()
{
    return RPCHelpMan{"getrawaddrman",
        "EXPERIMENTAL warning: this call may be changed in future releases.\n"
        "\nReturns information on all address manager entries for the new and tried tables.\n",
        {},
        RPCResult{
            RPCResult::Type::OBJ_DYN, "", "", {
                {RPCResult::Type::OBJ_DYN, "table", "buckets with addresses in the address manager table ( new, tried )", {
                    {RPCResult::Type::OBJ, "bucket/position", "the location in the address manager table (<bucket>/<position>)", {
                        {RPCResult::Type::STR, "address", "The address of the node"},
                        {RPCResult::Type::NUM, "mapped_as", /*optional=*/true, "The ASN mapped to the IP of this peer per our current ASMap"},
                        {RPCResult::Type::NUM, "port", "The port number of the node"},
                        {RPCResult::Type::STR, "network", "The network (" + Join(GetNetworkNames(), ", ") + ") of the address"},
                        {RPCResult::Type::NUM, "services", "The services offered by the node"},
                        {RPCResult::Type::NUM_TIME, "time", "The " + UNIX_EPOCH_TIME + " when the node was last seen"},
                        {RPCResult::Type::STR, "source", "The address that relayed the address to us"},
                        {RPCResult::Type::STR, "source_network", "The network (" + Join(GetNetworkNames(), ", ") + ") of the source address"},
                        {RPCResult::Type::NUM, "source_mapped_as", /*optional=*/true, "The ASN mapped to the IP of this peer's source per our current ASMap"}
                    }}
                }}
            }
        },
        RPCExamples{
            HelpExampleCli("getrawaddrman", "")
            + HelpExampleRpc("getrawaddrman", "")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue {
            AddrMan& addrman = EnsureAnyAddrman(request.context);
            NodeContext& node_context = EnsureAnyNodeContext(request.context);
            CConnman& connman = EnsureConnman(node_context);

            UniValue ret(UniValue::VOBJ);
            ret.pushKV("new", AddrmanTableToJSON(addrman.GetEntries(false), connman));
            ret.pushKV("tried", AddrmanTableToJSON(addrman.GetEntries(true), connman));
            return ret;
        },
    };
}